

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelControl.cpp
# Opt level: O1

void trackerboy::ChannelControl<(trackerboy::ChType)3>::clear(IApuIo *apu)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = 0x1f;
  do {
    (*apu->_vptr_IApuIo[1])(apu,(ulong)bVar2,0);
    bVar2 = bVar2 + 1;
  } while (bVar2 != 0x24);
  iVar1 = (**apu->_vptr_IApuIo)(apu,0x25);
  (*apu->_vptr_IApuIo[1])(apu,0x25,(ulong)((byte)iVar1 & 0x77));
  return;
}

Assistant:

void ChannelControl<ch>::clear(IApuIo &apu) noexcept {
    // clear registers
    constexpr uint8_t regno = IApuIo::REG_NR10 + (+ch * GB_CHANNEL_REGS);
    for (uint8_t i = 0; i != GB_CHANNEL_REGS; ++i) {
        apu.writeRegister(regno + i, 0);
    }
    // clear terminals for the channel
    auto nr51 = apu.readRegister(IApuIo::REG_NR51);
    nr51 &= ~((uint8_t)0x11 << (+ch));
    apu.writeRegister(IApuIo::REG_NR51, nr51);
}